

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_if.cpp
# Opt level: O2

IfCase __thiscall pfederc::Parser::parseIfStart(Parser *this,bool isensure)

{
  bool bVar1;
  int in_EDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX_00;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false> _Var2;
  pointer *__ptr;
  undefined7 in_register_00000031;
  Parser *this_00;
  Parser *this_01;
  IfCase IVar3;
  _Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false> local_58;
  undefined1 local_4c [4];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  undefined2 local_3a;
  undefined1 local_30 [16];
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,isensure);
  if (in_EDX == 0) {
    bVar1 = expect(this_00,TOK_KW_IF);
    if (bVar1) goto LAB_00115150;
    local_4c._0_2_ = 2;
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0x22;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_58,(SyntaxErrorCode *)local_4c,(Position *)&bodyExpr);
    this_01 = (Parser *)local_30;
  }
  else {
    bVar1 = expect(this_00,TOK_KW_ENSURE);
    if (bVar1) goto LAB_00115150;
    local_4c._0_2_ = 2;
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0x23;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_58,(SyntaxErrorCode *)local_4c,(Position *)&bodyExpr);
    this_01 = (Parser *)(local_30 + 8);
  }
  generateError(this_01,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this_00);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_01);
  std::
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)&local_58);
LAB_00115150:
  parseExpression((Parser *)&local_58,isensure);
  bVar1 = expect(this_00,TOK_EOL);
  if (!bVar1) {
    local_3a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_4c = (undefined1  [4])0xf;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&bodyExpr,(SyntaxErrorCode *)&stack0xffffffffffffffc6,(Position *)local_4c);
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_00);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&bodyExpr);
    skipToEol(this_00);
  }
  parseFunctionBody((Parser *)&bodyExpr);
  this->lexer = (Lexer *)bodyExpr._M_t.
                         super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                         .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
  bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
       (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0;
  (this->errors).
  super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._M_head_impl;
  local_58._M_head_impl = (Error<pfederc::SyntaxErrorCode> *)0x0;
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&bodyExpr);
  _Var2._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       extraout_RDX._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (local_58._M_head_impl != (Error<pfederc::SyntaxErrorCode> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
    _Var2._M_head_impl._M_t.
    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         extraout_RDX_00._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  IVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
  ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       _Var2._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  IVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
        )(_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
          )this;
  return (IfCase)IVar3.
                 super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  ;
}

Assistant:

IfCase Parser::parseIfStart(bool isensure) noexcept {
  // parse 'ensure' or 'if'
  if (isensure && !expect(TokenType::TOK_KW_ENSURE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_ENSURE,
          lexer.getCurrentToken()->getPosition()));
  } else if (!isensure && !expect(TokenType::TOK_KW_IF)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_IF,
          lexer.getCurrentToken()->getPosition()));
  }
  // parse condition
  std::unique_ptr<Expr> cond(parseExpression());
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  // result
  return IfCase(std::move(cond), std::move(bodyExpr));
}